

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O2

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int _h;
  uint _c;
  size_t _elemsize;
  void *pvVar2;
  void *pvVar3;
  int i;
  ulong uVar4;
  int q_2;
  int q_1;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int q_3;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  float local_130;
  int local_124;
  Mat sqsum;
  Mat sum;
  Mat local_70;
  
  iVar5 = bottom_blob->w;
  _h = bottom_blob->h;
  _c = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  Mat::create(top_blob,iVar5,_h,_c,_elemsize,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  Mat::Mat(&sum,_c,_elemsize,opt->workspace_allocator);
  local_124 = -100;
  if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
    uVar8 = _h * iVar5;
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar8) {
      uVar7 = (ulong)uVar8;
    }
    uVar9 = 0;
    if (0 < (int)_c) {
      uVar9 = (ulong)_c;
    }
    for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
      Mat::channel(&sqsum,bottom_blob,(int)uVar6);
      pvVar2 = sqsum.data;
      Mat::~Mat(&sqsum);
      fVar10 = 0.0;
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        fVar10 = fVar10 + *(float *)((long)pvVar2 + uVar4 * 4);
      }
      *(float *)((long)sum.data + uVar6 * 4) = fVar10;
    }
    if (this->across_channels == 0) {
      for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
        Mat::channel(&sqsum,bottom_blob,(int)uVar6);
        pvVar2 = sqsum.data;
        Mat::~Mat(&sqsum);
        Mat::channel(&sqsum,top_blob,(int)uVar6);
        pvVar3 = sqsum.data;
        Mat::~Mat(&sqsum);
        fVar10 = *(float *)((long)sum.data + uVar6 * 4);
        for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          *(float *)((long)pvVar3 + uVar4 * 4) =
               *(float *)((long)pvVar2 + uVar4 * 4) - fVar10 * (1.0 / (float)(int)uVar8);
        }
      }
    }
    else {
      local_130 = 0.0;
      for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        local_130 = local_130 + *(float *)((long)sum.data + uVar6 * 4);
      }
      for (iVar5 = 0; iVar5 != (int)uVar9; iVar5 = iVar5 + 1) {
        Mat::channel(&sqsum,bottom_blob,iVar5);
        pvVar2 = sqsum.data;
        Mat::~Mat(&sqsum);
        Mat::channel(&sqsum,top_blob,iVar5);
        pvVar3 = sqsum.data;
        Mat::~Mat(&sqsum);
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          *(float *)((long)pvVar3 + uVar6 * 4) =
               *(float *)((long)pvVar2 + uVar6 * 4) - local_130 / (float)(int)(_c * uVar8);
        }
      }
    }
    if (this->normalize_variance != 0) {
      Mat::Mat(&sqsum,_c,_elemsize,opt->workspace_allocator);
      if ((sqsum.data == (void *)0x0) || ((long)sqsum.c * sqsum.cstep == 0)) {
        Mat::~Mat(&sqsum);
        goto LAB_00133ac7;
      }
      for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
        Mat::channel(&local_70,top_blob,(int)uVar6);
        pvVar2 = local_70.data;
        Mat::~Mat(&local_70);
        fVar10 = 0.0;
        for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          fVar1 = *(float *)((long)pvVar2 + uVar4 * 4);
          fVar10 = fVar10 + fVar1 * fVar1;
        }
        *(float *)((long)sqsum.data + uVar6 * 4) = fVar10;
      }
      if (this->across_channels == 0) {
        for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
          Mat::channel(&local_70,top_blob,(int)uVar6);
          pvVar2 = local_70.data;
          Mat::~Mat(&local_70);
          fVar10 = *(float *)((long)sqsum.data + uVar6 * 4);
          fVar1 = this->eps;
          for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
            *(float *)((long)pvVar2 + uVar4 * 4) =
                 *(float *)((long)pvVar2 + uVar4 * 4) *
                 (1.0 / (SQRT(fVar10 * (1.0 / (float)(int)uVar8)) + fVar1));
          }
        }
      }
      else {
        fVar10 = 0.0;
        for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
          fVar10 = fVar10 + *(float *)((long)sqsum.data + uVar6 * 4);
        }
        fVar1 = this->eps;
        for (iVar5 = 0; iVar5 != (int)uVar9; iVar5 = iVar5 + 1) {
          Mat::channel(&local_70,top_blob,iVar5);
          pvVar2 = local_70.data;
          Mat::~Mat(&local_70);
          for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            *(float *)((long)pvVar2 + uVar6 * 4) =
                 *(float *)((long)pvVar2 + uVar6 * 4) *
                 (1.0 / (SQRT(fVar10 / (float)(int)(_c * uVar8)) + fVar1));
          }
        }
      }
      Mat::~Mat(&sqsum);
    }
    local_124 = 0;
  }
LAB_00133ac7:
  Mat::~Mat(&sum);
  return local_124;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = static_cast<float>(sqrt(sqmean) + eps);
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = static_cast<float>(sqrt(sqmean) + eps);
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}